

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

string_t duckdb::VectorTryCastStringOperator<duckdb::TryCastToVarInt>::
         Operation<double,duckdb::string_t>(double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  Vector *result;
  string_t output;
  anon_union_16_2_67f50693_for_value local_50;
  string local_40;
  
  result = *dataptr;
  bVar1 = DoubleToVarInt<double>(input,(string_t *)&local_50.pointer,result);
  if (!bVar1) {
    CastExceptionText<double,duckdb::string_t>(&local_40,(duckdb *)result,input);
    local_50.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         HandleVectorCastError::Operation<duckdb::string_t>
                   (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(
		        OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->result, data->parameters))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}